

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_graph.hpp
# Opt level: O2

void __thiscall
Disa::Adjacency_Graph<false>::Adjacency_Graph
          (Adjacency_Graph<false> *this,
          initializer_list<std::pair<unsigned_long,_unsigned_long>_> edge_graph)

{
  pair<unsigned_long,_unsigned_long> *ppVar1;
  size_t size_edge;
  pair<unsigned_long,_unsigned_long> *__first;
  ulong size_vertex;
  long lVar2;
  const_iterator __begin2;
  
  size_edge = edge_graph._M_len;
  __first = edge_graph._M_array;
  lVar2 = size_edge * 0x10;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  ppVar1 = std::
           __max_element<std::pair<unsigned_long,unsigned_long>const*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<unsigned_long,unsigned_long>const&,std::pair<unsigned_long,unsigned_long>const&)>>
                     (__first,__first + size_edge,
                      (_Iter_comp_iter<bool_(*)(const_std::pair<unsigned_long,_unsigned_long>_&,_const_std::pair<unsigned_long,_unsigned_long>_&)>
                       )0x1235a8);
  size_vertex = ppVar1->second;
  if (ppVar1->second < ppVar1->first) {
    size_vertex = ppVar1->first;
  }
  reserve(this,size_vertex,size_edge);
  for (; lVar2 != 0; lVar2 = lVar2 + -0x10) {
    insert(this,__first);
    __first = __first + 1;
  }
  shrink_to_fit(this);
  return;
}

Assistant:

Adjacency_Graph<_directed>::Adjacency_Graph(std::initializer_list<Edge> edge_graph) {
  const auto iter = std::max_element(edge_graph.begin(), edge_graph.end(),
                                     !_directed ?
                                      [](const Edge& edge_0, const Edge& edge_1) {
                                          return order_edge_vertex(&edge_0).second < order_edge_vertex(&edge_1).second;
                                        } :
                                      [](const Edge& edge_0, const Edge& edge_1) {
                                          return edge_0.second < edge_1.second;
                                        });
  reserve(!_directed ? std::max(iter->first, iter->second) : iter->first, edge_graph.size());
  FOR_EACH(edge, edge_graph) insert(edge);
  shrink_to_fit();
}